

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

QByteArray * QUrl::toAce(QString *domain,AceProcessingOptions options)

{
  long lVar1;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  AceProcessingOptions in_stack_0000005c;
  QString *in_stack_ffffffffffffff88;
  AceLeadingDot in_stack_ffffffffffffffb0;
  AceOperation in_stack_ffffffffffffffb4;
  QString *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qt_ACE_do(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
            in_stack_0000005c);
  QString::toLatin1(in_stack_ffffffffffffff88);
  QString::~QString((QString *)0x2feb64);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QUrl::toAce(const QString &domain, AceProcessingOptions options)
{
    return qt_ACE_do(domain, ToAceOnly, ForbidLeadingDot /*FIXME: make configurable*/, options)
            .toLatin1();
}